

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

iterator cmOutputConverter::Shell_SkipMakeVariables(iterator c,iterator end)

{
  bool bVar1;
  bool local_23;
  char *local_20;
  iterator skip;
  iterator end_local;
  iterator c_local;
  
  end_local = c;
  while( true ) {
    bVar1 = false;
    if (((end_local != end) && (bVar1 = false, end_local + 1 != end)) &&
       (bVar1 = false, *end_local == '$')) {
      bVar1 = end_local[1] == '(';
    }
    if (!bVar1) {
      return end_local;
    }
    local_20 = end_local + 2;
    while( true ) {
      local_23 = false;
      if (local_20 != end) {
        local_23 = Shell_CharIsMakeVariableName(*local_20);
      }
      if (local_23 == false) break;
      local_20 = local_20 + 1;
    }
    if (local_20 == end) break;
    if (*local_20 != ')') {
      return end_local;
    }
    end_local = local_20 + 1;
  }
  return end_local;
}

Assistant:

cm::string_view::iterator cmOutputConverter::Shell_SkipMakeVariables(
  cm::string_view::iterator c, cm::string_view::iterator end)
{
  while ((c != end && (c + 1) != end) && (*c == '$' && *(c + 1) == '(')) {
    cm::string_view::iterator skip = c + 2;
    while ((skip != end) && Shell_CharIsMakeVariableName(*skip)) {
      ++skip;
    }
    if ((skip != end) && *skip == ')') {
      c = skip + 1;
    } else {
      break;
    }
  }
  return c;
}